

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

pair<sjtu::map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::iterator,_bool>
* __thiscall
sjtu::map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::
insert(pair<sjtu::map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::iterator,_bool>
       *__return_storage_ptr__,
      map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>
      *this,value_type *value)

{
  CacheNode *pCVar1;
  Node *node;
  value_type *pvVar2;
  bool bVar3;
  
  node = search(this,&value->first);
  bVar3 = node == this->nil;
  if (bVar3) {
    node = (Node *)operator_new(0x28);
    pvVar2 = (value_type *)operator_new(0x10);
    pCVar1 = value->second;
    pvVar2->first = value->first;
    pvVar2->second = pCVar1;
    node->value = pvVar2;
    node->color = RED;
    node->left = (Node *)0x0;
    node->right = (Node *)0x0;
    node->parent = (Node *)0x0;
    insert(this,node);
  }
  (__return_storage_ptr__->first).cor = this;
  (__return_storage_ptr__->first).ptr = node;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator , bool> insert(const value_type &value)
	{
		Node *node = search(value.first);
		if (node == nil)
		{
			node = new Node (new value_type (value) , RED) , insert(node);
			return std::make_pair(iterator(this , node) , true);
		}
		else return std::make_pair(iterator(this , node) , false);
	}